

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O3

char * in_rooms(level *lev,xchar x,xchar y,int typewanted)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  uint uVar4;
  long lVar5;
  byte bVar6;
  int iVar7;
  undefined7 in_register_00000011;
  int iVar8;
  undefined7 in_register_00000031;
  uint uVar9;
  uint uVar10;
  int iVar11;
  char *local_68;
  
  uVar10 = *(uint *)&lev->locations[(int)CONCAT71(in_register_00000031,x)]
                     [(int)CONCAT71(in_register_00000011,y)].field_0x6;
  local_68 = in_rooms::buf + 4;
  uVar4 = uVar10 >> 0x10 & 0x3f;
  if (uVar4 != 0) {
    if (uVar4 == 1) {
      uVar10 = 2;
    }
    else {
      if (uVar4 != 2) {
        if ((typewanted != 0) && (cVar1 = lev->rooms[uVar4 - 3].rtype, cVar1 != typewanted)) {
          if (typewanted != 0x12) {
            return local_68;
          }
          if (cVar1 < '\x13') {
            return local_68;
          }
        }
        local_68 = in_rooms::buf + 3;
        in_rooms::buf[3] = (byte)(uVar10 >> 0x10) & 0x3f;
        return local_68;
      }
      uVar10 = 1;
    }
    uVar4 = 0;
    if (0x4f < (byte)x) {
      uVar4 = uVar10;
    }
    uVar2 = 0;
    if (x < '\x01') {
      uVar2 = uVar10;
    }
    iVar7 = x + -1 + uVar2;
    if (x < '\x01') {
      uVar4 = 0;
    }
    iVar8 = ((int)x - uVar4) + 1;
    iVar11 = (int)(char)iVar7;
    if (iVar11 <= iVar8) {
      uVar4 = 2 - uVar10;
      if (0xec < (byte)(y - 0x14U)) {
        uVar4 = 2;
      }
      uVar2 = 0;
      if (y < '\x01') {
        uVar2 = uVar10;
      }
      lVar5 = (long)(int)(uVar2 + (int)y + -1);
      bVar6 = (char)uVar10 * '\x02';
      local_68 = in_rooms::buf + 4;
      do {
        cVar1 = (char)iVar7;
        uVar2 = *(uint *)&lev->locations[cVar1][lVar5].field_0x6;
        uVar9 = uVar2 >> 0x10 & 0x3f;
        if ((2 < uVar9) && (pcVar3 = strchr(local_68,uVar9), pcVar3 == (char *)0x0)) {
          if (typewanted != 0) {
            iVar7 = (int)lev->rooms[uVar9 - 3].rtype;
            if ((iVar7 != typewanted) && (typewanted != 0x12 || iVar7 < 0x13)) goto LAB_001abf11;
          }
          local_68[-1] = (byte)(uVar2 >> 0x10) & 0x3f;
          local_68 = local_68 + -1;
        }
LAB_001abf11:
        if (uVar10 <= uVar4) {
          uVar2 = *(uint *)&lev->locations[cVar1][lVar5 + (ulong)uVar10].field_0x6;
          uVar9 = uVar2 >> 0x10 & 0x3f;
          if ((2 < uVar9) && (pcVar3 = strchr(local_68,uVar9), pcVar3 == (char *)0x0)) {
            if (typewanted != 0) {
              iVar7 = (int)lev->rooms[uVar9 - 3].rtype;
              if ((iVar7 != typewanted) && (typewanted != 0x12 || iVar7 < 0x13)) goto LAB_001abf97;
            }
            local_68[-1] = (byte)(uVar2 >> 0x10) & 0x3f;
            local_68 = local_68 + -1;
          }
LAB_001abf97:
          if (bVar6 <= uVar4) {
            uVar2 = *(uint *)&lev->locations[cVar1][lVar5 + (ulong)bVar6].field_0x6;
            uVar9 = uVar2 >> 0x10 & 0x3f;
            if ((2 < uVar9) && (pcVar3 = strchr(local_68,uVar9), pcVar3 == (char *)0x0)) {
              if (typewanted != 0) {
                iVar7 = (int)lev->rooms[uVar9 - 3].rtype;
                if ((iVar7 != typewanted) && (typewanted != 0x12 || iVar7 < 0x13))
                goto LAB_001ac014;
              }
              local_68[-1] = (byte)(uVar2 >> 0x10) & 0x3f;
              local_68 = local_68 + -1;
            }
          }
        }
LAB_001ac014:
        iVar7 = iVar11 + uVar10;
        iVar11 = (int)(char)iVar7;
      } while (iVar11 <= iVar8);
    }
  }
  return local_68;
}

Assistant:

char *in_rooms(const struct level *lev, xchar x, xchar y, int typewanted)
{
	static char buf[5];
	char rno, *ptr = &buf[4];
	int typefound, min_x, min_y, max_x, max_y_offset, step;
	const struct rm *loc;

#define goodtype(rno) (!typewanted || \
	     ((typefound = lev->rooms[rno - ROOMOFFSET].rtype) == typewanted) || \
	     ((typewanted == SHOPBASE) && (typefound > SHOPBASE))) \

	switch (rno = lev->locations[x][y].roomno) {
		case NO_ROOM:
			return ptr;
		case SHARED:
			step = 2;
			break;
		case SHARED_PLUS:
			step = 1;
			break;
		default:			/* i.e. a regular room # */
			if (goodtype(rno))
				*(--ptr) = rno;
			return ptr;
	}

	min_x = x - 1;
	max_x = x + 1;
	if (x < 1)
		min_x += step;
	else
	if (x >= COLNO)
		max_x -= step;

	min_y = y - 1;
	max_y_offset = 2;
	if (min_y < 0) {
		min_y += step;
		max_y_offset -= step;
	} else
	if ((min_y + max_y_offset) >= ROWNO)
		max_y_offset -= step;

	for (x = min_x; x <= max_x; x += step) {
		loc = &lev->locations[x][min_y];
		y = 0;
		if (((rno = loc[y].roomno) >= ROOMOFFSET) &&
		    !strchr(ptr, rno) && goodtype(rno))
			*(--ptr) = rno;
		y += step;
		if (y > max_y_offset)
			continue;
		if (((rno = loc[y].roomno) >= ROOMOFFSET) &&
		    !strchr(ptr, rno) && goodtype(rno))
			*(--ptr) = rno;
		y += step;
		if (y > max_y_offset)
			continue;
		if (((rno = loc[y].roomno) >= ROOMOFFSET) &&
		    !strchr(ptr, rno) && goodtype(rno))
			*(--ptr) = rno;
	}
	return ptr;
}